

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDriverRTASFormatCompatibilityCheckExt
          (ze_driver_handle_t hDriver,ze_rtas_format_ext_t rtasFormatA,
          ze_rtas_format_ext_t rtasFormatB)

{
  ze_pfnDriverRTASFormatCompatibilityCheckExt_t pfnRTASFormatCompatibilityCheckExt;
  ze_result_t result;
  ze_rtas_format_ext_t rtasFormatB_local;
  ze_rtas_format_ext_t rtasFormatA_local;
  ze_driver_handle_t hDriver_local;
  
  pfnRTASFormatCompatibilityCheckExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c208 != (code *)0x0) {
    pfnRTASFormatCompatibilityCheckExt._4_4_ = (*DAT_0011c208)(hDriver,rtasFormatA,rtasFormatB);
  }
  return pfnRTASFormatCompatibilityCheckExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDriverRTASFormatCompatibilityCheckExt(
        ze_driver_handle_t hDriver,                     ///< [in] handle of driver object
        ze_rtas_format_ext_t rtasFormatA,               ///< [in] operand A
        ze_rtas_format_ext_t rtasFormatB                ///< [in] operand B
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnRTASFormatCompatibilityCheckExt = context.zeDdiTable.Driver.pfnRTASFormatCompatibilityCheckExt;
        if( nullptr != pfnRTASFormatCompatibilityCheckExt )
        {
            result = pfnRTASFormatCompatibilityCheckExt( hDriver, rtasFormatA, rtasFormatB );
        }
        else
        {
            // generic implementation
        }

        return result;
    }